

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

void __thiscall txpackage_tests::package_hash_tests::test_method(package_hash_tests *this)

{
  long lVar1;
  string_view hex;
  string_view hex_00;
  string_view hex_01;
  string_view hex_02;
  string_view hex_03;
  string_view hex_04;
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  Span<const_std::byte> sp_01;
  bool bVar2;
  _Cat _Var3;
  transaction_identifier<true> *ptVar4;
  Wtxid *pWVar5;
  transaction_identifier<false> *ptVar6;
  Txid *pTVar7;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe438;
  CTransaction *in_stack_ffffffffffffe440;
  char *in_stack_ffffffffffffe448;
  DataStream *in_stack_ffffffffffffe450;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffe458;
  const_string *in_stack_ffffffffffffe460;
  size_t in_stack_ffffffffffffe468;
  const_string *in_stack_ffffffffffffe470;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffe478;
  initializer_list<std::shared_ptr<const_CTransaction>_> in_stack_ffffffffffffe480;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffe4c8;
  undefined1 *local_19b0;
  undefined1 *local_1988;
  undefined1 *local_1960;
  undefined1 *local_1938;
  undefined1 *local_1910;
  undefined1 *local_18e8;
  package_hash_tests *this_local;
  undefined1 local_1628 [16];
  undefined1 local_1618 [64];
  undefined1 local_15d8 [16];
  undefined1 local_15c8 [64];
  undefined1 local_1588 [16];
  undefined1 local_1578 [64];
  undefined1 local_1538 [16];
  undefined1 local_1528 [64];
  undefined1 local_14e8 [16];
  undefined1 local_14d8 [64];
  undefined1 local_1498 [16];
  undefined1 local_1488 [64];
  const_string local_1448 [2];
  lazy_ostream local_1428 [2];
  assertion_result local_1408 [2];
  const_string local_13d0 [2];
  lazy_ostream local_13b0 [2];
  assertion_result local_1390 [2];
  const_string local_1358 [2];
  lazy_ostream local_1338 [2];
  assertion_result local_1318 [2];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_321;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_312;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_213;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_231;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_132;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  package_123;
  const_string local_1220 [2];
  lazy_ostream local_1200 [2];
  assertion_result local_11e0 [2];
  const_string local_11a8 [2];
  lazy_ostream local_1188 [2];
  assertion_result local_1168 [2];
  const_string local_1130 [2];
  lazy_ostream local_1110 [2];
  assertion_result local_10f0 [2];
  const_string local_10b8 [2];
  lazy_ostream local_1098 [2];
  assertion_result local_1078 [2];
  const_string local_1040 [2];
  lazy_ostream local_1020 [2];
  assertion_result local_1000 [2];
  const_string local_fc8 [2];
  lazy_ostream local_fa8 [2];
  assertion_result local_f80 [2];
  undefined1 local_f48 [16];
  undefined1 local_f38 [64];
  undefined1 local_ef8 [16];
  undefined1 local_ee8 [64];
  undefined1 local_ea8 [16];
  undefined1 local_e98 [112];
  const_string local_e28 [2];
  lazy_ostream local_e08 [2];
  assertion_result local_de0 [2];
  const_string local_da8 [2];
  lazy_ostream local_d88 [2];
  assertion_result local_d60 [2];
  undefined1 local_d28 [16];
  undefined1 local_d18 [64];
  undefined1 local_cd8 [16];
  undefined1 local_cc8 [64];
  undefined1 local_c88 [16];
  undefined1 local_c78 [112];
  CTransactionRef ptx_3;
  DataStream stream_3;
  CTransactionRef ptx_2;
  DataStream stream_2;
  CTransactionRef ptx_1;
  DataStream stream_1;
  undefined1 local_b48 [64];
  undefined1 local_b08 [64];
  undefined1 local_ac8 [64];
  uchar local_a88 [112];
  uint256 hash_if_use_int_order;
  uint256 hash_if_use_txid;
  uint256 hash_if_by_txid;
  uint256 calculated_hash_123;
  undefined1 local_850 [48];
  undefined1 local_820 [48];
  undefined1 local_7f0 [48];
  undefined1 local_7c0 [48];
  undefined1 local_790 [48];
  undefined1 local_760 [48];
  undefined1 local_730 [103];
  Txid txid_3;
  Txid txid_2;
  Txid txid_1;
  Wtxid wtxid_3;
  Wtxid wtxid_2;
  Wtxid wtxid_1;
  CTransaction tx_3;
  CTransaction tx_2;
  CTransaction tx_1;
  
  local_1000[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1000[0]._1_7_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<447UL>___2,_0,_0,_0,_0,_1,_1,_150,_75,_138,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,223ul>>
            ((Span<const_std::byte> *)in_stack_ffffffffffffe448,
             (array<std::byte,_223UL> *)in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  sp.m_size = in_stack_ffffffffffffe468;
  sp.m_data = (byte *)in_stack_ffffffffffffe460;
  DataStream::DataStream(in_stack_ffffffffffffe450,sp);
  CTransaction::CTransaction<DataStream>(&tx_1,&::TX_WITH_WITNESS,&stream_1);
  MakeTransactionRef<CTransaction&>(in_stack_ffffffffffffe440);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<517UL>___1,_0,_0,_0,_1,_11,_38,_233,_183,_115,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,258ul>>
            ((Span<const_std::byte> *)in_stack_ffffffffffffe448,
             (array<std::byte,_258UL> *)in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  sp_00.m_size = in_stack_ffffffffffffe468;
  sp_00.m_data = (byte *)in_stack_ffffffffffffe460;
  DataStream::DataStream(in_stack_ffffffffffffe450,sp_00);
  CTransaction::CTransaction<DataStream>(&tx_2,&::TX_WITH_WITNESS,&stream_2);
  MakeTransactionRef<CTransaction&>(in_stack_ffffffffffffe440);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<641UL>___2,_0,_0,_0,_0,_1,_1,_119,_134,_40,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,320ul>>
            ((Span<const_std::byte> *)in_stack_ffffffffffffe448,
             (array<std::byte,_320UL> *)in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  sp_01.m_size = in_stack_ffffffffffffe468;
  sp_01.m_data = (byte *)in_stack_ffffffffffffe460;
  DataStream::DataStream(in_stack_ffffffffffffe450,sp_01);
  CTransaction::CTransaction<DataStream>(&tx_3,&::TX_WITH_WITNESS,&stream_3);
  MakeTransactionRef<CTransaction&>(in_stack_ffffffffffffe440);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe458,(char *)in_stack_ffffffffffffe450);
  hex._M_str = (char *)in_stack_ffffffffffffe460;
  hex._M_len = (size_t)in_stack_ffffffffffffe458;
  transaction_identifier<true>::FromHex(hex);
  ptVar4 = std::optional<transaction_identifier<true>_>::value
                     ((optional<transaction_identifier<true>_> *)in_stack_ffffffffffffe448);
  wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  wtxid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe458,(char *)in_stack_ffffffffffffe450);
  hex_00._M_str = (char *)in_stack_ffffffffffffe460;
  hex_00._M_len = (size_t)in_stack_ffffffffffffe458;
  transaction_identifier<true>::FromHex(hex_00);
  ptVar4 = std::optional<transaction_identifier<true>_>::value
                     ((optional<transaction_identifier<true>_> *)in_stack_ffffffffffffe448);
  wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  wtxid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe458,(char *)in_stack_ffffffffffffe450);
  hex_01._M_str = (char *)in_stack_ffffffffffffe460;
  hex_01._M_len = (size_t)in_stack_ffffffffffffe458;
  transaction_identifier<true>::FromHex(hex_01);
  ptVar4 = std::optional<transaction_identifier<true>_>::value
                     ((optional<transaction_identifier<true>_> *)in_stack_ffffffffffffe448);
  wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  wtxid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((ptVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    pWVar5 = CTransaction::GetWitnessHash((CTransaction *)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe448 = "wtxid_1";
    in_stack_ffffffffffffe440 = (CTransaction *)&wtxid_1;
    in_stack_ffffffffffffe438 = "tx_1.GetWitnessHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
              (local_c78,local_c88,0x4f,1,2,pWVar5);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    pWVar5 = CTransaction::GetWitnessHash((CTransaction *)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe448 = "wtxid_2";
    in_stack_ffffffffffffe440 = (CTransaction *)&wtxid_2;
    in_stack_ffffffffffffe438 = "tx_2.GetWitnessHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
              (local_cc8,local_cd8,0x50,1,2,pWVar5);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    pWVar5 = CTransaction::GetWitnessHash((CTransaction *)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe448 = "wtxid_3";
    in_stack_ffffffffffffe440 = (CTransaction *)&wtxid_3;
    in_stack_ffffffffffffe438 = "tx_3.GetWitnessHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
              (local_d18,local_d28,0x51,1,2,pWVar5);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    transaction_identifier<true>::GetHex_abi_cxx11_
              ((transaction_identifier<true> *)in_stack_ffffffffffffe440);
    transaction_identifier<true>::GetHex_abi_cxx11_
              ((transaction_identifier<true> *)in_stack_ffffffffffffe440);
    _Var3 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe440,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe438);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_ffffffffffffe438,(__unspec *)0xb5c899);
    std::operator<(_Var3._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d60,local_d88,local_da8,0x53,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe438);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    transaction_identifier<true>::GetHex_abi_cxx11_
              ((transaction_identifier<true> *)in_stack_ffffffffffffe440);
    transaction_identifier<true>::GetHex_abi_cxx11_
              ((transaction_identifier<true> *)in_stack_ffffffffffffe440);
    _Var3 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe440,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe438);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_ffffffffffffe438,(__unspec *)0xb5ca63);
    std::operator<(_Var3._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_de0,local_e08,local_e28,0x54,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe438);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe458,(char *)in_stack_ffffffffffffe450);
  hex_02._M_str = (char *)in_stack_ffffffffffffe460;
  hex_02._M_len = (size_t)in_stack_ffffffffffffe458;
  transaction_identifier<false>::FromHex(hex_02);
  ptVar6 = std::optional<transaction_identifier<false>_>::value
                     ((optional<transaction_identifier<false>_> *)in_stack_ffffffffffffe448);
  txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  txid_1.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe458,(char *)in_stack_ffffffffffffe450);
  hex_03._M_str = (char *)in_stack_ffffffffffffe460;
  hex_03._M_len = (size_t)in_stack_ffffffffffffe458;
  transaction_identifier<false>::FromHex(hex_03);
  ptVar6 = std::optional<transaction_identifier<false>_>::value
                     ((optional<transaction_identifier<false>_> *)in_stack_ffffffffffffe448);
  txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  txid_2.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe458,(char *)in_stack_ffffffffffffe450);
  hex_04._M_str = (char *)in_stack_ffffffffffffe460;
  hex_04._M_len = (size_t)in_stack_ffffffffffffe458;
  transaction_identifier<false>::FromHex(hex_04);
  ptVar6 = std::optional<transaction_identifier<false>_>::value
                     ((optional<transaction_identifier<false>_> *)in_stack_ffffffffffffe448);
  txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  txid_3.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((ptVar6->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    pTVar7 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe448 = "txid_1";
    in_stack_ffffffffffffe440 = (CTransaction *)&txid_1;
    in_stack_ffffffffffffe438 = "tx_1.GetHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<false>,transaction_identifier<false>>
              (local_e98,local_ea8,0x5a,1,2,pTVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    pTVar7 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe448 = "txid_2";
    in_stack_ffffffffffffe440 = (CTransaction *)&txid_2;
    in_stack_ffffffffffffe438 = "tx_2.GetHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<false>,transaction_identifier<false>>
              (local_ee8,local_ef8,0x5b,1,2,pTVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    pTVar7 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe448 = "txid_3";
    in_stack_ffffffffffffe440 = (CTransaction *)&txid_3;
    in_stack_ffffffffffffe438 = "tx_3.GetHash()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<false>,transaction_identifier<false>>
              (local_f38,local_f48,0x5c,1,2,pTVar7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    transaction_identifier<false>::GetHex_abi_cxx11_
              ((transaction_identifier<false> *)in_stack_ffffffffffffe440);
    transaction_identifier<false>::GetHex_abi_cxx11_
              ((transaction_identifier<false> *)in_stack_ffffffffffffe440);
    _Var3 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe440,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe438);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_ffffffffffffe438,(__unspec *)0xb5d135);
    std::operator<(_Var3._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f80,local_fa8,local_fc8,0x5e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe438);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    transaction_identifier<false>::ToUint256
              ((transaction_identifier<false> *)in_stack_ffffffffffffe438);
    transaction_identifier<true>::ToUint256
              ((transaction_identifier<true> *)in_stack_ffffffffffffe438);
    ::operator!=((base_blob<256U> *)in_stack_ffffffffffffe448,
                 (base_blob<256U> *)in_stack_ffffffffffffe440);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1000,local_1020,local_1040,0x60,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    transaction_identifier<false>::ToUint256
              ((transaction_identifier<false> *)in_stack_ffffffffffffe438);
    transaction_identifier<true>::ToUint256
              ((transaction_identifier<true> *)in_stack_ffffffffffffe438);
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffe448,
                 (base_blob<256U> *)in_stack_ffffffffffffe440);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1078,local_1098,local_10b8,0x61,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    transaction_identifier<false>::ToUint256
              ((transaction_identifier<false> *)in_stack_ffffffffffffe438);
    transaction_identifier<true>::ToUint256
              ((transaction_identifier<true> *)in_stack_ffffffffffffe438);
    ::operator!=((base_blob<256U> *)in_stack_ffffffffffffe448,
                 (base_blob<256U> *)in_stack_ffffffffffffe440);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10f0,local_1110,local_1130,0x62,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    transaction_identifier<true>::operator<
              ((transaction_identifier<true> *)in_stack_ffffffffffffe448,
               (transaction_identifier<true> *)in_stack_ffffffffffffe440);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1168,local_1188,local_11a8,0x66,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    transaction_identifier<true>::operator<
              ((transaction_identifier<true> *)in_stack_ffffffffffffe448,
               (transaction_identifier<true> *)in_stack_ffffffffffffe440);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_11e0,local_1200,local_1220,0x68,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5da1c);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5da31);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5da46);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffe478,in_stack_ffffffffffffe480,
           (allocator_type *)in_stack_ffffffffffffe470);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  local_18e8 = local_730;
  do {
    local_18e8 = local_18e8 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438);
  } while (local_18e8 != local_760);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5db1a);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5db2f);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5db44);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffe478,in_stack_ffffffffffffe480,
           (allocator_type *)in_stack_ffffffffffffe470);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  local_1910 = local_760;
  do {
    local_1910 = local_1910 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438);
  } while (local_1910 != local_790);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5dc18);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5dc2d);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5dc42);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffe478,in_stack_ffffffffffffe480,
           (allocator_type *)in_stack_ffffffffffffe470);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  local_1938 = local_790;
  do {
    local_1938 = local_1938 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438);
  } while (local_1938 != local_7c0);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5dd16);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5dd2b);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5dd40);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffe478,in_stack_ffffffffffffe480,
           (allocator_type *)in_stack_ffffffffffffe470);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  local_1960 = local_7c0;
  do {
    local_1960 = local_1960 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438);
  } while (local_1960 != local_7f0);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5de14);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5de29);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5de3e);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffe478,in_stack_ffffffffffffe480,
           (allocator_type *)in_stack_ffffffffffffe470);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  local_1988 = local_7f0;
  do {
    local_1988 = local_1988 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438);
  } while (local_1988 != local_820);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5df12);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5df27);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438,
             (shared_ptr<const_CTransaction> *)0xb5df3c);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffe478,in_stack_ffffffffffffe480,
           (allocator_type *)in_stack_ffffffffffffe470);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffe438);
  local_19b0 = local_820;
  do {
    local_19b0 = local_19b0 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438);
  } while (local_19b0 != local_850);
  HashWriter::HashWriter((HashWriter *)in_stack_ffffffffffffe438);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<true> *)in_stack_ffffffffffffe440);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<true> *)in_stack_ffffffffffffe440);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<true> *)in_stack_ffffffffffffe440);
  HashWriter::GetSHA256((HashWriter *)in_stack_ffffffffffffe448);
  HashWriter::HashWriter((HashWriter *)in_stack_ffffffffffffe438);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<true> *)in_stack_ffffffffffffe440);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<true> *)in_stack_ffffffffffffe440);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<true> *)in_stack_ffffffffffffe440);
  HashWriter::GetSHA256((HashWriter *)in_stack_ffffffffffffe448);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    ::operator!=((base_blob<256U> *)in_stack_ffffffffffffe448,
                 (base_blob<256U> *)in_stack_ffffffffffffe440);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1318,local_1338,local_1358,0x75,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  HashWriter::HashWriter((HashWriter *)in_stack_ffffffffffffe438);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<false> *)in_stack_ffffffffffffe440);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<false> *)in_stack_ffffffffffffe440);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<false> *)in_stack_ffffffffffffe440);
  HashWriter::GetSHA256((HashWriter *)in_stack_ffffffffffffe448);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    ::operator!=((base_blob<256U> *)in_stack_ffffffffffffe448,
                 (base_blob<256U> *)in_stack_ffffffffffffe440);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1390,local_13b0,local_13d0,0x78,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_a88[0x50] = '\0';
  local_a88[0x51] = '\0';
  local_a88[0x52] = '\0';
  local_a88[0x53] = '\0';
  local_a88[0x54] = '\0';
  local_a88[0x55] = '\0';
  local_a88[0x56] = '\0';
  local_a88[0x57] = '\0';
  local_a88[0x58] = '\0';
  local_a88[0x59] = '\0';
  local_a88[0x5a] = '\0';
  local_a88[0x5b] = '\0';
  local_a88[0x5c] = '\0';
  local_a88[0x5d] = '\0';
  local_a88[0x5e] = '\0';
  local_a88[0x5f] = '\0';
  local_a88[0x40] = '\0';
  local_a88[0x41] = '\0';
  local_a88[0x42] = '\0';
  local_a88[0x43] = '\0';
  local_a88[0x44] = '\0';
  local_a88[0x45] = '\0';
  local_a88[0x46] = '\0';
  local_a88[0x47] = '\0';
  local_a88[0x48] = '\0';
  local_a88[0x49] = '\0';
  local_a88[0x4a] = '\0';
  local_a88[0x4b] = '\0';
  local_a88[0x4c] = '\0';
  local_a88[0x4d] = '\0';
  local_a88[0x4e] = '\0';
  local_a88[0x4f] = '\0';
  local_a88[0x30] = '\0';
  local_a88[0x31] = '\0';
  local_a88[0x32] = '\0';
  local_a88[0x33] = '\0';
  local_a88[0x34] = '\0';
  local_a88[0x35] = '\0';
  local_a88[0x36] = '\0';
  local_a88[0x37] = '\0';
  local_a88[0x38] = '\0';
  local_a88[0x39] = 0;
  local_a88[0x3a] = 0;
  local_a88[0x3b] = 0;
  local_a88[0x3c] = 0;
  local_a88[0x3d] = 0;
  local_a88[0x3e] = 0;
  local_a88[0x3f] = 0;
  local_a88[0x20] = '\0';
  local_a88[0x21] = '\0';
  local_a88[0x22] = '\0';
  local_a88[0x23] = '\0';
  local_a88[0x24] = '\0';
  local_a88[0x25] = '\0';
  local_a88[0x26] = '\0';
  local_a88[0x27] = '\0';
  local_a88[0x28] = '\0';
  local_a88[0x29] = '\0';
  local_a88[0x2a] = '\0';
  local_a88[0x2b] = '\0';
  local_a88[0x2c] = '\0';
  local_a88[0x2d] = '\0';
  local_a88[0x2e] = '\0';
  local_a88[0x2f] = '\0';
  local_a88[0x10] = '\0';
  local_a88[0x11] = '\0';
  local_a88[0x12] = '\0';
  local_a88[0x13] = '\0';
  local_a88[0x14] = '\0';
  local_a88[0x15] = '\0';
  local_a88[0x16] = '\0';
  local_a88[0x17] = '\0';
  local_a88[0x18] = '\0';
  local_a88[0x19] = '\0';
  local_a88[0x1a] = '\0';
  local_a88[0x1b] = '\0';
  local_a88[0x1c] = '\0';
  local_a88[0x1d] = '\0';
  local_a88[0x1e] = '\0';
  local_a88[0x1f] = '\0';
  local_a88[0] = '\0';
  local_a88[1] = '\0';
  local_a88[2] = '\0';
  local_a88[3] = '\0';
  local_a88[4] = '\0';
  local_a88[5] = '\0';
  local_a88[6] = '\0';
  local_a88[7] = '\0';
  local_a88[8] = '\0';
  local_a88[9] = '\0';
  local_a88[10] = '\0';
  local_a88[0xb] = '\0';
  local_a88[0xc] = '\0';
  local_a88[0xd] = '\0';
  local_a88[0xe] = '\0';
  local_a88[0xf] = '\0';
  local_a88[0x60] = '\0';
  local_a88[0x61] = '\0';
  local_a88[0x62] = '\0';
  local_a88[99] = '\0';
  local_a88[100] = '\0';
  local_a88[0x65] = '\0';
  local_a88[0x66] = '\0';
  local_a88[0x67] = '\0';
  HashWriter::HashWriter((HashWriter *)in_stack_ffffffffffffe438);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<true> *)in_stack_ffffffffffffe440);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<true> *)in_stack_ffffffffffffe440);
  HashWriter::operator<<
            ((HashWriter *)in_stack_ffffffffffffe448,
             (transaction_identifier<true> *)in_stack_ffffffffffffe440);
  HashWriter::GetSHA256((HashWriter *)in_stack_ffffffffffffe448);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    ::operator!=((base_blob<256U> *)in_stack_ffffffffffffe448,
                 (base_blob<256U> *)in_stack_ffffffffffffe440);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe448,
               SUB81((ulong)in_stack_ffffffffffffe440 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    in_stack_ffffffffffffe438 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1408,local_1428,local_1448,0x7b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe438);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    GetPackageHash(in_stack_ffffffffffffe4c8);
    in_stack_ffffffffffffe448 = "GetPackageHash(package_123)";
    in_stack_ffffffffffffe440 = (CTransaction *)(local_ac8 + 0x20);
    in_stack_ffffffffffffe438 = "calculated_hash_123";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_1488,local_1498,0x7d,1,2,&calculated_hash_123);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    GetPackageHash(in_stack_ffffffffffffe4c8);
    in_stack_ffffffffffffe448 = "GetPackageHash(package_132)";
    in_stack_ffffffffffffe440 = (CTransaction *)local_ac8;
    in_stack_ffffffffffffe438 = "calculated_hash_123";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_14d8,local_14e8,0x7e,1,2,&calculated_hash_123);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    GetPackageHash(in_stack_ffffffffffffe4c8);
    in_stack_ffffffffffffe448 = "GetPackageHash(package_231)";
    in_stack_ffffffffffffe440 = (CTransaction *)(local_b08 + 0x20);
    in_stack_ffffffffffffe438 = "calculated_hash_123";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_1528,local_1538,0x7f,1,2,&calculated_hash_123);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    GetPackageHash(in_stack_ffffffffffffe4c8);
    in_stack_ffffffffffffe448 = "GetPackageHash(package_213)";
    in_stack_ffffffffffffe440 = (CTransaction *)local_b08;
    in_stack_ffffffffffffe438 = "calculated_hash_123";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_1578,local_1588,0x80,1,2,&calculated_hash_123);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    GetPackageHash(in_stack_ffffffffffffe4c8);
    in_stack_ffffffffffffe448 = "GetPackageHash(package_312)";
    in_stack_ffffffffffffe440 = (CTransaction *)(local_b48 + 0x20);
    in_stack_ffffffffffffe438 = "calculated_hash_123";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_15c8,local_15d8,0x81,1,2,&calculated_hash_123);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe438);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
               in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe440,(char (*) [1])in_stack_ffffffffffffe438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe448,
               (pointer)in_stack_ffffffffffffe440,(unsigned_long)in_stack_ffffffffffffe438);
    GetPackageHash(in_stack_ffffffffffffe4c8);
    in_stack_ffffffffffffe448 = "GetPackageHash(package_321)";
    in_stack_ffffffffffffe440 = (CTransaction *)local_b48;
    in_stack_ffffffffffffe438 = "calculated_hash_123";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_1618,local_1628,0x82,1,2,&calculated_hash_123);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe438);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffe448);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffe448);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffe448);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffe448);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffe448);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffe448);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe438);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffe438);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe438);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffe438);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffe438);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffe438);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffe438);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(package_hash_tests)
{
    // Random real segwit transaction
    DataStream stream_1{
        "02000000000101964b8aa63509579ca6086e6012eeaa4c2f4dd1e283da29b67c8eea38b3c6fd220000000000fdffffff0294c618000000000017a9145afbbb42f4e83312666d0697f9e66259912ecde38768fa2c0000000000160014897388a0889390fd0e153a22bb2cf9d8f019faf50247304402200547406380719f84d68cf4e96cc3e4a1688309ef475b150be2b471c70ea562aa02206d255f5acc40fd95981874d77201d2eb07883657ce1c796513f32b6079545cdf0121023ae77335cefcb5ab4c1dc1fb0d2acfece184e593727d7d5906c78e564c7c11d125cf0c00"_hex,
    };
    CTransaction tx_1(deserialize, TX_WITH_WITNESS, stream_1);
    CTransactionRef ptx_1{MakeTransactionRef(tx_1)};

    // Random real nonsegwit transaction
    DataStream stream_2{
        "01000000010b26e9b7735eb6aabdf358bab62f9816a21ba9ebdb719d5299e88607d722c190000000008b4830450220070aca44506c5cef3a16ed519d7c3c39f8aab192c4e1c90d065f37b8a4af6141022100a8e160b856c2d43d27d8fba71e5aef6405b8643ac4cb7cb3c462aced7f14711a0141046d11fee51b0e60666d5049a9101a72741df480b96ee26488a4d3466b95c9a40ac5eeef87e10a5cd336c19a84565f80fa6c547957b7700ff4dfbdefe76036c339ffffffff021bff3d11000000001976a91404943fdd508053c75000106d3bc6e2754dbcff1988ac2f15de00000000001976a914a266436d2965547608b9e15d9032a7b9d64fa43188ac00000000"_hex,
    };
    CTransaction tx_2(deserialize, TX_WITH_WITNESS, stream_2);
    CTransactionRef ptx_2{MakeTransactionRef(tx_2)};

    // Random real segwit transaction
    DataStream stream_3{
        "0200000000010177862801f77c2c068a70372b4c435ef8dd621291c36a64eb4dd491f02218f5324600000000fdffffff014a0100000000000022512035ea312034cfac01e956a269f3bf147f569c2fbb00180677421262da042290d803402be713325ff285e66b0380f53f2fae0d0fb4e16f378a440fed51ce835061437566729d4883bc917632f3cff474d6384bc8b989961a1d730d4a87ed38ad28bd337b20f1d658c6c138b1c312e072b4446f50f01ae0da03a42e6274f8788aae53416a7fac0063036f7264010118746578742f706c61696e3b636861727365743d7574662d3800357b2270223a226272632d3230222c226f70223a226d696e74222c227469636b223a224342414c222c22616d74223a2236393639227d6821c1f1d658c6c138b1c312e072b4446f50f01ae0da03a42e6274f8788aae53416a7f00000000"_hex,
    };
    CTransaction tx_3(deserialize, TX_WITH_WITNESS, stream_3);
    CTransactionRef ptx_3{MakeTransactionRef(tx_3)};

    // It's easy to see that wtxids are sorted in lexicographical order:
    Wtxid wtxid_1{Wtxid::FromHex("85cd1a31eb38f74ed5742ec9cb546712ab5aaf747de28a9168b53e846cbda17f").value()};
    Wtxid wtxid_2{Wtxid::FromHex("b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b").value()};
    Wtxid wtxid_3{Wtxid::FromHex("e065bac15f62bb4e761d761db928ddee65a47296b2b776785abb912cdec474e3").value()};
    BOOST_CHECK_EQUAL(tx_1.GetWitnessHash(), wtxid_1);
    BOOST_CHECK_EQUAL(tx_2.GetWitnessHash(), wtxid_2);
    BOOST_CHECK_EQUAL(tx_3.GetWitnessHash(), wtxid_3);

    BOOST_CHECK(wtxid_1.GetHex() < wtxid_2.GetHex());
    BOOST_CHECK(wtxid_2.GetHex() < wtxid_3.GetHex());

    // The txids are not (we want to test that sorting and hashing use wtxid, not txid):
    Txid txid_1{Txid::FromHex("bd0f71c1d5e50589063e134fad22053cdae5ab2320db5bf5e540198b0b5a4e69").value()};
    Txid txid_2{Txid::FromHex("b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b").value()};
    Txid txid_3{Txid::FromHex("ee707be5201160e32c4fc715bec227d1aeea5940fb4295605e7373edce3b1a93").value()};
    BOOST_CHECK_EQUAL(tx_1.GetHash(), txid_1);
    BOOST_CHECK_EQUAL(tx_2.GetHash(), txid_2);
    BOOST_CHECK_EQUAL(tx_3.GetHash(), txid_3);

    BOOST_CHECK(txid_2.GetHex() < txid_1.GetHex());

    BOOST_CHECK(txid_1.ToUint256() != wtxid_1.ToUint256());
    BOOST_CHECK(txid_2.ToUint256() == wtxid_2.ToUint256());
    BOOST_CHECK(txid_3.ToUint256() != wtxid_3.ToUint256());

    // We are testing that both functions compare using GetHex() and not uint256.
    // (in this pair of wtxids, hex string order != uint256 order)
    BOOST_CHECK(wtxid_2 < wtxid_1);
    // (in this pair of wtxids, hex string order == uint256 order)
    BOOST_CHECK(wtxid_2 < wtxid_3);

    // All permutations of the package containing ptx_1, ptx_2, ptx_3 have the same package hash
    std::vector<CTransactionRef> package_123{ptx_1, ptx_2, ptx_3};
    std::vector<CTransactionRef> package_132{ptx_1, ptx_3, ptx_2};
    std::vector<CTransactionRef> package_231{ptx_2, ptx_3, ptx_1};
    std::vector<CTransactionRef> package_213{ptx_2, ptx_1, ptx_3};
    std::vector<CTransactionRef> package_312{ptx_3, ptx_1, ptx_2};
    std::vector<CTransactionRef> package_321{ptx_3, ptx_2, ptx_1};

    uint256 calculated_hash_123 = (HashWriter() << wtxid_1 << wtxid_2 << wtxid_3).GetSHA256();

    uint256 hash_if_by_txid = (HashWriter() << wtxid_2 << wtxid_1 << wtxid_3).GetSHA256();
    BOOST_CHECK(hash_if_by_txid != calculated_hash_123);

    uint256 hash_if_use_txid = (HashWriter() << txid_2 << txid_1 << txid_3).GetSHA256();
    BOOST_CHECK(hash_if_use_txid != calculated_hash_123);

    uint256 hash_if_use_int_order = (HashWriter() << wtxid_2 << wtxid_1 << wtxid_3).GetSHA256();
    BOOST_CHECK(hash_if_use_int_order != calculated_hash_123);

    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_123));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_132));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_231));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_213));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_312));
    BOOST_CHECK_EQUAL(calculated_hash_123, GetPackageHash(package_321));
}